

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int av1_compute_num_fp_contexts(AV1_PRIMARY *ppi,AV1EncoderConfig *oxcf)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long in_RSI;
  long in_RDI;
  bool bVar4;
  int num_fp_contexts;
  int max_threads;
  int workers_per_frame;
  int index;
  int is_sb_64;
  int is_480p_or_lesser;
  int scaling_factor [2];
  int rounding_factor [2];
  int max_num_enc_workers;
  int local_68;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_50;
  int local_48;
  int local_44;
  int local_2c [5];
  long local_18;
  long local_10;
  int local_4;
  
  *(undefined4 *)(in_RDI + 0x123fc) = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar2 = av1_check_fpmt_config
                    ((AV1_PRIMARY *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (AV1EncoderConfig *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (iVar2 == 0) {
    local_4 = 1;
  }
  else {
    local_68 = compute_max_num_enc_workers
                         ((CommonModeInfoParams *)(*(long *)(local_10 + 0x160) + 0x3c188),
                          *(int *)(*(long *)(*(long *)(local_10 + 0x160) + 0x42008) + 0x24));
    local_2c[2] = 2;
    local_2c[3] = 4;
    local_2c[0] = 4;
    local_2c[1] = 8;
    if (*(int *)(local_18 + 0x18) < *(int *)(local_18 + 0x1c)) {
      local_48 = *(int *)(local_18 + 0x18);
    }
    else {
      local_48 = *(int *)(local_18 + 0x1c);
    }
    bVar4 = false;
    if (*(long *)(local_10 + 0x160) != 0) {
      bVar4 = *(char *)(*(long *)(*(long *)(local_10 + 0x160) + 0x42008) + 0x1c) == '\f';
    }
    bVar1 = false;
    if (0x1e0 < local_48) {
      bVar1 = bVar4;
    }
    uVar3 = (uint)bVar1;
    if ((local_68 + local_2c[(long)(int)uVar3 + 2]) / local_2c[(int)uVar3] < 1) {
      local_50 = 1;
    }
    else {
      local_50 = (local_68 + local_2c[(long)(int)uVar3 + 2]) / local_2c[(int)uVar3];
    }
    local_44 = *(int *)(local_18 + 0x408) / local_50;
    if (((0 < *(int *)(local_18 + 0x150)) || (0 < *(int *)(local_18 + 0x154))) && (local_44 < 4)) {
      local_44 = 1;
    }
    iVar2 = local_44;
    if (3 < local_44) {
      iVar2 = 4;
    }
    if (iVar2 < 1) {
      local_44 = 1;
    }
    else if (3 < local_44) {
      local_44 = 4;
    }
    if ((*(int *)(local_10 + 0x148) != 1) && (*(int *)(local_10 + 0x148) <= local_44)) {
      local_44 = *(int *)(local_10 + 0x148);
    }
    local_4 = local_44;
    if (1 < local_44) {
      if (local_68 * local_44 < *(int *)(local_18 + 0x408)) {
        local_68 = local_68 * local_44;
      }
      else {
        local_68 = *(int *)(local_18 + 0x408);
      }
      *(int *)(local_10 + 0x123fc) = local_68;
    }
  }
  return local_4;
}

Assistant:

int av1_compute_num_fp_contexts(AV1_PRIMARY *ppi, AV1EncoderConfig *oxcf) {
  ppi->p_mt_info.num_mod_workers[MOD_FRAME_ENC] = 0;
  if (!av1_check_fpmt_config(ppi, oxcf)) {
    return 1;
  }
  int max_num_enc_workers = compute_max_num_enc_workers(
      &ppi->cpi->common.mi_params, ppi->cpi->common.seq_params->mib_size_log2);
  // Scaling factors and rounding factors used to tune worker_per_frame
  // computation.
  int rounding_factor[2] = { 2, 4 };
  int scaling_factor[2] = { 4, 8 };
  int is_480p_or_lesser =
      AOMMIN(oxcf->frm_dim_cfg.width, oxcf->frm_dim_cfg.height) <= 480;
  int is_sb_64 = 0;
  if (ppi->cpi != NULL)
    is_sb_64 = ppi->cpi->common.seq_params->sb_size == BLOCK_64X64;
  // A parallel frame encode has at least 1/4th the
  // theoretical limit of max enc workers in default case. For resolutions
  // larger than 480p, if SB size is 64x64, optimal performance is obtained with
  // limit of 1/8.
  int index = (!is_480p_or_lesser && is_sb_64) ? 1 : 0;
  int workers_per_frame =
      AOMMAX(1, (max_num_enc_workers + rounding_factor[index]) /
                    scaling_factor[index]);
  int max_threads = oxcf->max_threads;
  int num_fp_contexts = max_threads / workers_per_frame;
  // Based on empirical results, FPMT gains with multi-tile are significant when
  // more parallel frames are available. Use FPMT with multi-tile encode only
  // when sufficient threads are available for parallel encode of
  // MAX_PARALLEL_FRAMES frames.
  if (oxcf->tile_cfg.tile_columns > 0 || oxcf->tile_cfg.tile_rows > 0) {
    if (num_fp_contexts < MAX_PARALLEL_FRAMES) num_fp_contexts = 1;
  }

  num_fp_contexts = AOMMAX(1, AOMMIN(num_fp_contexts, MAX_PARALLEL_FRAMES));
  // Limit recalculated num_fp_contexts to ppi->num_fp_contexts.
  num_fp_contexts = (ppi->num_fp_contexts == 1)
                        ? num_fp_contexts
                        : AOMMIN(num_fp_contexts, ppi->num_fp_contexts);
  if (num_fp_contexts > 1) {
    ppi->p_mt_info.num_mod_workers[MOD_FRAME_ENC] =
        AOMMIN(max_num_enc_workers * num_fp_contexts, oxcf->max_threads);
  }
  return num_fp_contexts;
}